

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GLSL420Pack::InitializerListTest::testInit(InitializerListTest *this)

{
  pointer *pptVar1;
  iterator iVar2;
  GLuint i;
  TESTED_INITIALIZERS TVar3;
  GLuint col;
  GLuint GVar4;
  GLuint row;
  GLuint GVar5;
  testCase test_case;
  testCase local_3c;
  
  TVar3 = VECTOR;
  local_3c.m_initializer = VECTOR;
  local_3c.m_n_cols = 1;
  GVar4 = 2;
  do {
    iVar2._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_3c.m_n_rows = GVar4;
      std::
      vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::InitializerListTest::testCase_const&>
                ((vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>>
                  *)&this->m_test_cases,iVar2,&local_3c);
    }
    else {
      (iVar2._M_current)->m_n_rows = GVar4;
      (iVar2._M_current)->m_initializer = local_3c.m_initializer;
      (iVar2._M_current)->m_n_cols = local_3c.m_n_cols;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    GVar4 = GVar4 + 1;
  } while (GVar4 != 5);
  while (TVar3 = TVar3 + MATRIX, TVar3 != TESTED_INITIALIZERS_MAX) {
    GVar4 = 2;
    local_3c.m_initializer = TVar3;
    do {
      GVar5 = 2;
      do {
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_3c.m_n_cols = GVar4;
          local_3c.m_n_rows = GVar5;
          std::
          vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>>
          ::_M_realloc_insert<gl4cts::GLSL420Pack::InitializerListTest::testCase_const&>
                    ((vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>>
                      *)&this->m_test_cases,iVar2,&local_3c);
        }
        else {
          (iVar2._M_current)->m_n_rows = GVar5;
          (iVar2._M_current)->m_initializer = local_3c.m_initializer;
          (iVar2._M_current)->m_n_cols = GVar4;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        GVar5 = GVar5 + 1;
      } while (GVar5 != 5);
      GVar4 = GVar4 + 1;
    } while (GVar4 != 5);
  }
  return true;
}

Assistant:

bool InitializerListTest::testInit()
{
	for (GLuint i = 0; i < TESTED_INITIALIZERS_MAX; ++i)
	{
		const TESTED_INITIALIZERS l_init = (TESTED_INITIALIZERS)i;

		testCase test_case = { l_init, 1, 1 };

		switch (l_init)
		{
		case VECTOR:
		case ARRAY_VECTOR_CTR:
		case ARRAY_VECTOR_LIST:
		case UNSIZED_ARRAY_VECTOR:
			for (GLuint row = 2; row <= 4; ++row)
			{
				test_case.m_n_rows = row;

				m_test_cases.push_back(test_case);
			}

			break;

		case MATRIX:
		case MATRIX_ROWS:
		case ARRAY_MATRIX_CTR:
		case ARRAY_MATRIX_LIST:
		case UNSIZED_ARRAY_MATRIX:
			for (GLuint col = 2; col <= 4; ++col)
			{
				for (GLuint row = 2; row <= 4; ++row)
				{
					test_case.m_n_cols = col;
					test_case.m_n_rows = row;

					m_test_cases.push_back(test_case);
				}
			}

			break;

		case ARRAY_SCALAR:
		case UNSIZED_ARRAY_SCALAR:
			m_test_cases.push_back(test_case);

			break;

		case STRUCT:
		case ARRAY_STRUCT:
		case NESTED_STRUCT_CTR:
		case NESTED_STRUCT_LIST:
		case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		case UNSIZED_ARRAY_STRUCT:
			test_case.m_n_rows = 4;
			m_test_cases.push_back(test_case);

			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}

	return true;
}